

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O3

void __thiscall wmj::fileWatcher::fileWatcher::run(fileWatcher *this)

{
  bool bVar1;
  
  if (this->need_watching == true) {
    do {
      bVar1 = watchOnce(this);
      if (bVar1) {
        if ((this->call_back_func).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->call_back_func)._M_invoker)((_Any_data *)&this->call_back_func);
      }
    } while (this->need_watching != false);
  }
  return;
}

Assistant:

void fileWatcher::run() {
    while(need_watching) {
        if(watchOnce()) {
            this->call_back_func();
        }
    }
}